

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall QTableModel::clearItemData(QTableModel *this,QModelIndex *index)

{
  bool bVar1;
  ulong uVar2;
  QTableWidgetItem *pQVar3;
  QTableModel *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QTableWidgetItem *itm;
  const_iterator endIter;
  const_iterator beginIter;
  CheckIndexOption in_stack_ffffffffffffff6c;
  QList<QWidgetItemData> *in_stack_ffffffffffffff70;
  QTableModel *pQVar4;
  bool local_49;
  undefined1 local_48 [24];
  QWidgetItemData *local_30;
  QWidgetItemData *local_28;
  QWidgetItemData *local_20;
  QWidgetItemData *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RSI;
  QFlags<QAbstractItemModel::CheckIndexOption>::QFlags
            ((QFlags<QAbstractItemModel::CheckIndexOption> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c);
  uVar2 = QAbstractItemModel::checkIndex((QModelIndex *)in_RDI,(QFlags_conflict1 *)pQVar4);
  if ((uVar2 & 1) == 0) {
    local_49 = false;
  }
  else {
    pQVar3 = item(pQVar4,in_RDI);
    if (pQVar3 == (QTableWidgetItem *)0x0) {
      local_49 = false;
    }
    else {
      local_18 = (QWidgetItemData *)&DAT_aaaaaaaaaaaaaaaa;
      local_18 = (QWidgetItemData *)QList<QWidgetItemData>::cbegin(in_stack_ffffffffffffff70);
      local_20 = (QWidgetItemData *)&DAT_aaaaaaaaaaaaaaaa;
      local_30 = (QWidgetItemData *)QList<QWidgetItemData>::cend(in_stack_ffffffffffffff70);
      local_28 = local_18;
      local_20 = local_30;
      bVar1 = std::
              all_of<QList<QWidgetItemData>::const_iterator,QTableModel::clearItemData(QModelIndex_const&)::__0>
                        (local_18);
      if (bVar1) {
        local_49 = true;
      }
      else {
        QList<QWidgetItemData>::clear(in_stack_ffffffffffffff70);
        pQVar4 = in_RSI;
        memset(local_48,0,0x18);
        QList<int>::QList((QList<int> *)0x8d677a);
        QAbstractItemModel::dataChanged
                  ((QModelIndex *)in_RDI,(QModelIndex *)pQVar4,(QList_conflict2 *)in_RSI);
        QList<int>::~QList((QList<int> *)0x8d679d);
        local_49 = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QTableWidgetItem *itm = item(index);
    if (!itm)
        return false;
    const auto beginIter = itm->values.cbegin();
    const auto endIter = itm->values.cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); }))
        return true; //it's already cleared
    itm->values.clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}